

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

int Wlc_BlastLess2(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits)

{
  int iVar1;
  int local_30;
  int local_2c;
  int iRes;
  int iKnown;
  int k;
  int nBits_local;
  int *pArg1_local;
  int *pArg0_local;
  Gia_Man_t *pNew_local;
  
  local_2c = 0;
  local_30 = 0;
  iRes = nBits + -1;
  while( true ) {
    if (iRes < 0) {
      return local_30;
    }
    iVar1 = Abc_LitNot(pArg0[iRes]);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,pArg1[iRes]);
    local_30 = Gia_ManHashMux(pNew,local_2c,local_30,iVar1);
    iVar1 = Gia_ManHashXor(pNew,pArg0[iRes],pArg1[iRes]);
    local_2c = Gia_ManHashOr(pNew,local_2c,iVar1);
    if (local_2c == 1) break;
    iRes = iRes + -1;
  }
  return local_30;
}

Assistant:

int Wlc_BlastLess2( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits )
{
    int k, iKnown = 0, iRes = 0;
    for ( k = nBits - 1; k >= 0; k-- )
    {
        iRes   = Gia_ManHashMux( pNew, iKnown, iRes, Gia_ManHashAnd(pNew, Abc_LitNot(pArg0[k]), pArg1[k]) );
        iKnown = Gia_ManHashOr( pNew, iKnown, Gia_ManHashXor(pNew, pArg0[k], pArg1[k]) );
        if ( iKnown == 1 )
            break;
    }
    return iRes;
}